

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QMetaCallEvent::QMetaCallEvent
          (QMetaCallEvent *this,SlotObjUniquePtr *slotO,QObject *sender,int signalId,int nargs)

{
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *in_RSI;
  QObject *in_RDI;
  undefined4 in_R8D;
  undefined8 in_stack_ffffffffffffffc0;
  QMetaCallEvent *in_stack_ffffffffffffffd0;
  
  QAbstractMetaCallEvent::QAbstractMetaCallEvent
            (&in_stack_ffffffffffffffd0->super_QAbstractMetaCallEvent,in_RDI,
             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(QSemaphore *)in_RSI);
  in_RDI->_vptr_QObject = (_func_int **)&PTR__QMetaCallEvent_00be7348;
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &in_RDI[2].d_ptr,in_RSI);
  in_RDI[3]._vptr_QObject = (_func_int **)0x0;
  in_RDI[3].d_ptr.d = (QObjectData *)0x0;
  *(undefined4 *)&in_RDI[4]._vptr_QObject = in_R8D;
  *(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 4) = 0;
  *(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 6) = 0xffff;
  in_RDI[6].d_ptr.d = (QObjectData *)0x0;
  in_RDI[7]._vptr_QObject = (_func_int **)0x0;
  in_RDI[5].d_ptr.d = (QObjectData *)0x0;
  in_RDI[6]._vptr_QObject = (_func_int **)0x0;
  in_RDI[4].d_ptr.d = (QObjectData *)0x0;
  in_RDI[5]._vptr_QObject = (_func_int **)0x0;
  allocArgs(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

QMetaCallEvent::QMetaCallEvent(QtPrivate::SlotObjUniquePtr slotO,
                               const QObject *sender, int signalId,
                               int nargs)
    : QAbstractMetaCallEvent(sender, signalId),
      d{std::move(slotO), nullptr, nullptr, nargs, 0, ushort(-1)},
      prealloc_()
{
    allocArgs();
}